

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderInvarianceBaseTest::TessellationShaderInvarianceBaseTest
          (TessellationShaderInvarianceBaseTest *this,Context *context,ExtParameters *extParams,
          char *name,char *description)

{
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderInvarianceBaseTest_02112a98;
  this->m_utils_ptr = (TessellationShaderUtils *)0x0;
  this->m_bo_id = 0;
  (this->m_programs).
  super__Vector_base<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_programs).
  super__Vector_base<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_programs).
  super__Vector_base<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_qo_tfpw_id = 0;
  this->m_vao_id = 0;
  return;
}

Assistant:

TessellationShaderInvarianceBaseTest::TessellationShaderInvarianceBaseTest(Context&				context,
																		   const ExtParameters& extParams,
																		   const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_utils_ptr(DE_NULL)
	, m_bo_id(0)
	, m_qo_tfpw_id(0)
	, m_vao_id(0)
{
	/* Left blank on purpose */
}